

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxscaler.hpp
# Opt level: O2

number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
* __thiscall
soplex::
SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::getRowMaxAbsUnscaled
          (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
           *__return_storage_ptr__,
          SPxScaler<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *this,SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                *lp,int i)

{
  undefined8 *puVar1;
  int iVar2;
  DataArray<int> *pDVar3;
  DataArray<int> *pDVar4;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar5;
  Real eps;
  int iVar6;
  bool bVar7;
  fpclass_type fVar8;
  int32_t iVar9;
  bool bVar10;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
  *a;
  long lVar11;
  long lVar12;
  Item *pIVar13;
  __shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2> local_190;
  uint local_180 [2];
  uint auStack_178 [2];
  uint local_170 [2];
  int local_168;
  bool local_164;
  fpclass_type local_160;
  int32_t local_15c;
  Tolerances *local_158;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_150;
  uint local_148 [2];
  uint auStack_140 [2];
  uint local_138 [4];
  Tolerances *local_128;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Stack_120;
  uint local_118 [2];
  uint auStack_110 [2];
  uint local_108 [2];
  int local_100;
  bool local_fc;
  fpclass_type local_f8;
  int32_t local_f4;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  undefined8 local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined4 local_80;
  undefined1 local_7c;
  undefined8 local_78;
  soplex local_68 [56];
  
  pDVar3 = this->m_activeColscaleExp;
  pDVar4 = this->m_activeRowscaleExp;
  pIVar13 = (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.theitem +
            (lp->
            super_LPRowSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            ).
            super_SVSetBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            .set.thekey[i].idx;
  boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
            (&__return_storage_ptr__->m_backend,0.0,(type *)0x0);
  iVar2 = pDVar4->data[i];
  lVar12 = 0x38;
  for (lVar11 = 0;
      lVar11 < (pIVar13->data).
               super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               .memused; lVar11 = lVar11 + 1) {
    pNVar5 = (pIVar13->data).
             super_SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
             .m_elem;
    puVar1 = (undefined8 *)((long)(&pNVar5->val + -1) + lVar12);
    local_a8 = *puVar1;
    uStack_a0 = puVar1[1];
    puVar1 = (undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar12 + -0x28);
    local_98 = *puVar1;
    uStack_90 = puVar1[1];
    local_88 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar12 + -0x18);
    local_80 = *(undefined4 *)((long)&(pNVar5->val).m_backend.data + lVar12 + -0x10);
    local_7c = *(undefined1 *)((long)&(pNVar5->val).m_backend.data + lVar12 + -0xc);
    local_78 = *(undefined8 *)((long)&(pNVar5->val).m_backend.data + lVar12 + -8);
    spxLdexp<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)local_68,(soplex *)&local_a8,
               (number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *)(ulong)(uint)-(pDVar3->data
                                 [*(int *)((long)&(pNVar5->val).m_backend.data + lVar12)] + iVar2),
               CONCAT31((int3)((uint)local_80 >> 8),local_7c));
    spxAbs<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)1>>
              ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)1>
                *)&local_190,local_68,a);
    iVar9 = local_15c;
    fVar8 = local_160;
    bVar7 = local_164;
    iVar6 = local_168;
    local_138[0] = local_170[0];
    local_138[1] = local_170[1];
    local_148[0] = local_180[0];
    local_148[1] = local_180[1];
    auStack_140[0] = auStack_178[0];
    auStack_140[1] = auStack_178[1];
    local_158 = local_190._M_ptr;
    p_Stack_150 = local_190._M_refcount._M_pi;
    local_118[0] = local_180[0];
    local_118[1] = local_180[1];
    auStack_110[0] = auStack_178[0];
    auStack_110[1] = auStack_178[1];
    local_108[0] = local_170[0];
    local_108[1] = local_170[1];
    local_128 = local_190._M_ptr;
    p_Stack_120 = local_190._M_refcount._M_pi;
    local_100 = local_168;
    local_fc = local_164;
    local_f8 = local_160;
    local_f4 = local_15c;
    local_e8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8);
    local_e8.m_backend.data._M_elems._0_8_ =
         *(undefined8 *)(__return_storage_ptr__->m_backend).data._M_elems;
    local_e8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 2);
    local_e8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 4);
    local_e8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 6);
    local_e8.m_backend.exp = (__return_storage_ptr__->m_backend).exp;
    local_e8.m_backend.neg = (__return_storage_ptr__->m_backend).neg;
    local_e8.m_backend.fpclass = (__return_storage_ptr__->m_backend).fpclass;
    local_e8.m_backend.prec_elem = (__return_storage_ptr__->m_backend).prec_elem;
    std::__shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_190,
               &(this->_tolerances).
                super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>);
    eps = Tolerances::epsilon(local_190._M_ptr);
    bVar10 = GT<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,double>
                       ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_128,&local_e8,eps);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_190._M_refcount);
    if (bVar10) {
      *(undefined8 *)((__return_storage_ptr__->m_backend).data._M_elems + 8) = local_138._0_8_;
      *(uint (*) [2])((__return_storage_ptr__->m_backend).data._M_elems + 4) = local_148;
      *(uint (*) [2])((__return_storage_ptr__->m_backend).data._M_elems + 6) = auStack_140;
      *(Tolerances **)(__return_storage_ptr__->m_backend).data._M_elems = local_158;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
       ((__return_storage_ptr__->m_backend).data._M_elems + 2) = p_Stack_150;
      (__return_storage_ptr__->m_backend).exp = iVar6;
      (__return_storage_ptr__->m_backend).neg = bVar7;
      (__return_storage_ptr__->m_backend).fpclass = fVar8;
      (__return_storage_ptr__->m_backend).prec_elem = iVar9;
    }
    lVar12 = lVar12 + 0x3c;
  }
  return __return_storage_ptr__;
}

Assistant:

R SPxScaler<R>::getRowMaxAbsUnscaled(const SPxLPBase<R>& lp, int i) const
{
   assert(i < lp.nRows());
   assert(i >= 0);
   DataArray < int >& colscaleExp = *m_activeColscaleExp;
   DataArray < int >& rowscaleExp = *m_activeRowscaleExp;
   const SVectorBase<R>& rowVec = lp.LPRowSetBase<R>::rowVector(i);

   R max = 0.0;

   int exp1;
   int exp2 = rowscaleExp[i];

   for(int j = 0; j < rowVec.size(); j++)
   {
      exp1 = colscaleExp[rowVec.index(j)];
      R abs = spxAbs(spxLdexp(rowVec.value(j), -exp1 - exp2));

      if(GT(abs, max, this->tolerances()->epsilon()))
         max = abs;
   }

   return max;
}